

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveFile::writeTempData(CDirectiveFile *this,TempData *tempData)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long *in_R8;
  long *in_R9;
  string str;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  _Alloc_hider local_20;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  switch(*(undefined4 *)&(this->super_CAssemblerCommand).field_0x14) {
  case 1:
    iVar1 = (*(((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&local_a0,(path *)CONCAT44(extraout_var,iVar1));
    local_60._M_dataplus._M_p =
         (pointer)((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->originalHeaderSize;
    tinyformat::format<std::__cxx11::string,long>
              (&local_40,(tinyformat *)".open \"%s\",0x%08X",(char *)&local_a0,&local_60,in_R8);
    break;
  case 2:
    iVar1 = (*(((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&local_a0,(path *)CONCAT44(extraout_var_01,iVar1));
    local_60._M_dataplus._M_p =
         (pointer)((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->originalHeaderSize;
    tinyformat::format<std::__cxx11::string,long>
              (&local_40,(tinyformat *)".create \"%s\",0x%08X",(char *)&local_a0,&local_60,in_R8);
    break;
  case 3:
    ghc::filesystem::path::u8string_abi_cxx11_
              (&local_a0,
               &((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->originalName);
    iVar1 = (*(((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_AssemblerFile)._vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&local_60,(path *)CONCAT44(extraout_var_00,iVar1));
    local_20._M_p =
         (pointer)((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->originalHeaderSize;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,long>
              (&local_40,(tinyformat *)".open \"%s\",\"%s\",0x%08X",(char *)&local_a0,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20,in_R9)
    ;
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = &local_60;
    goto LAB_001619b7;
  case 4:
    std::__cxx11::string::assign((char *)&local_80);
  default:
    goto switchD_00161895_default;
  }
  this_00 = &local_40;
  std::__cxx11::string::operator=((string *)&local_80,(string *)this_00);
LAB_001619b7:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_a0);
switchD_00161895_default:
  TempData::writeLine(tempData,this->virtualAddress,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void CDirectiveFile::writeTempData(TempData& tempData) const
{
	std::string str;

	switch (type)
	{
	case Type::Open:
		str = tfm::format(".open \"%s\",0x%08X",file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Create:
		str = tfm::format(".create \"%s\",0x%08X",file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Copy:
		str = tfm::format(".open \"%s\",\"%s\",0x%08X",file->getOriginalFileName().u8string(),
			file->getFileName().u8string(),file->getOriginalHeaderSize());
		break;
	case Type::Close:
		str = ".close";
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}

	tempData.writeLine(virtualAddress,str);
}